

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O2

void DynamicProfileStorage::ClearInfoMap(bool deleteFileStorage)

{
  char16_t *string;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  char16_t **ppcVar5;
  size_t sVar6;
  StorageInfo *this;
  uint uVar7;
  int index;
  char16 local_248 [4];
  char16 filename [260];
  
  uVar3 = infoMap.count - infoMap.freeCount;
  index = 0;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar7 = 0;
  do {
    if (uVar3 <= uVar7) {
      JsUtil::
      BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
      ::Clear(&infoMap);
      return;
    }
    ppcVar5 = JsUtil::
              BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
              ::GetKeyAt(&infoMap,index);
    string = *ppcVar5;
    if (string != (char16_t *)0x0) {
      sVar6 = PAL_wcslen(string);
      Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t_const>
                ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,sVar6 + 1,string);
      this = JsUtil::
             BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
             ::GetValueAt(&infoMap,index);
      if (this->isFileStorage == true) {
        if (useCacheDir == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                             ,0x1dc,"(useCacheDir)","useCacheDir");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        if (deleteFileStorage) {
          StorageInfo::GetFilename(this,local_248);
          _wunlink(local_248);
        }
      }
      else {
        DeleteRecord((this->field_1).record);
      }
      uVar7 = uVar7 + 1;
    }
    index = index + 1;
  } while( true );
}

Assistant:

void DynamicProfileStorage::ClearInfoMap(bool deleteFileStorage)
{
    uint recordCount = infoMap.Count();
    uint recordFreed = 0;
    for (uint i = 0; recordFreed < recordCount; i++)
    {
        char16 const * name = infoMap.GetKeyAt(i);
        if (name == nullptr)
        {
            continue;
        }
        NoCheckHeapDeleteArray(wcslen(name) + 1, name);

        StorageInfo const& info = infoMap.GetValueAt(i);
        if (info.isFileStorage)
        {
            AssertOrFailFast(useCacheDir);
            if (deleteFileStorage)
            {
                char16 filename[_MAX_PATH];
                info.GetFilename(filename);
                _wunlink(filename);
            }
        }
        else
        {
            DeleteRecord(info.record);
        }

        recordFreed++;
    }
    infoMap.Clear();
}